

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugUtilities.hpp
# Opt level: O0

void CheckDynamicType<Diligent::TextureViewVkImpl_const,Diligent::IDeviceObject>
               (IDeviceObject *pSrcPtr)

{
  undefined8 uVar1;
  Char *Message;
  long local_68;
  undefined1 local_41;
  char *local_40;
  char *local_38;
  undefined1 local_30 [8];
  string msg;
  IDeviceObject *pSrcPtr_local;
  
  if (pSrcPtr != (IDeviceObject *)0x0) {
    msg.field_2._8_8_ = pSrcPtr;
    if (pSrcPtr == (IDeviceObject *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = __dynamic_cast(pSrcPtr,&Diligent::IDeviceObject::typeinfo,
                                &Diligent::TextureViewVkImpl::typeinfo,0);
    }
    uVar1 = msg.field_2._8_8_;
    if (local_68 == 0) {
      if (msg.field_2._8_8_ == 0) {
        __cxa_bad_typeid();
      }
      local_38 = std::type_info::name(*(type_info **)(*(long *)uVar1 + -8));
      local_40 = std::type_info::name((type_info *)&Diligent::TextureViewVkImpl::typeinfo);
      local_41 = 0x27;
      Diligent::FormatString<char[40],char_const*,char[16],char_const*,char>
                ((string *)local_30,(Diligent *)"Dynamic type cast failed. Src typeid: \'",
                 (char (*) [40])&local_38,(char **)"\' Dst typeid: \'",(char (*) [16])&local_40,
                 (char **)&local_41,(char *)local_30);
      Message = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (Message,"CheckDynamicType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Platforms/Basic/interface/DebugUtilities.hpp"
                 ,0x3f);
      std::__cxx11::string::~string((string *)local_30);
    }
  }
  return;
}

Assistant:

void CheckDynamicType(SrcType* pSrcPtr)
{
    VERIFY(pSrcPtr == nullptr || dynamic_cast<DstType*>(pSrcPtr) != nullptr, "Dynamic type cast failed. Src typeid: \'", typeid(*pSrcPtr).name(), "\' Dst typeid: \'", typeid(DstType).name(), '\'');
}